

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Comparison.cpp
# Opt level: O0

bool CoreML::Specification::operator==(NeuralNetworkClassifier *a,NeuralNetworkClassifier *b)

{
  code *pcVar1;
  bool bVar2;
  ClassLabelsCase CVar3;
  ClassLabelsCase CVar4;
  RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *a_00;
  RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *b_00;
  RepeatedPtrField<CoreML::Specification::NeuralNetworkPreprocessing> *a_01;
  RepeatedPtrField<CoreML::Specification::NeuralNetworkPreprocessing> *b_01;
  Int64Vector *a_02;
  Int64Vector *b_02;
  StringVector *a_03;
  StringVector *b_03;
  NeuralNetworkClassifier *b_local;
  NeuralNetworkClassifier *a_local;
  
  a_00 = NeuralNetworkClassifier::layers(a);
  b_00 = NeuralNetworkClassifier::layers(b);
  bVar2 = operator!=(a_00,b_00);
  if (bVar2) {
    a_local._7_1_ = false;
  }
  else {
    a_01 = NeuralNetworkClassifier::preprocessing(a);
    b_01 = NeuralNetworkClassifier::preprocessing(b);
    bVar2 = operator!=(a_01,b_01);
    if (bVar2) {
      a_local._7_1_ = false;
    }
    else {
      CVar3 = NeuralNetworkClassifier::ClassLabels_case(a);
      CVar4 = NeuralNetworkClassifier::ClassLabels_case(b);
      if (CVar3 == CVar4) {
        CVar3 = NeuralNetworkClassifier::ClassLabels_case(a);
        if (CVar3 == CLASSLABELS_NOT_SET) {
          a_local._7_1_ = true;
        }
        else if (CVar3 == kStringClassLabels) {
          a_03 = NeuralNetworkClassifier::stringclasslabels(a);
          b_03 = NeuralNetworkClassifier::stringclasslabels(b);
          a_local._7_1_ = operator==(a_03,b_03);
        }
        else {
          if (CVar3 != kInt64ClassLabels) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          a_02 = NeuralNetworkClassifier::int64classlabels(a);
          b_02 = NeuralNetworkClassifier::int64classlabels(b);
          a_local._7_1_ = operator==(a_02,b_02);
        }
      }
      else {
        a_local._7_1_ = false;
      }
    }
  }
  return a_local._7_1_;
}

Assistant:

bool operator==(const NeuralNetworkClassifier& a,
                        const NeuralNetworkClassifier& b) {
            if (a.layers() != b.layers()) {
                return false;
            }
            if (a.preprocessing() != b.preprocessing()) {
                return false;
            }
            if (a.ClassLabels_case() != b.ClassLabels_case()) {
                return false;
            }
            switch (a.ClassLabels_case()) {
                case NeuralNetworkClassifier::kInt64ClassLabels:
                    return a.int64classlabels() == b.int64classlabels();
                case NeuralNetworkClassifier::kStringClassLabels:
                    return a.stringclasslabels() == b.stringclasslabels();
                case NeuralNetworkClassifier::CLASSLABELS_NOT_SET:
                    return true;
            }
        }